

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O2

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_basic_ostream
          (sync_basic_ostream<char,_std::char_traits<char>_> *this,comm *comm,int root)

{
  stringbuf *this_00;
  
  std::ios::ios((ios *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28);
  std::ostream::ostream(this);
  (this->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream =
       (_func_int **)&PTR__sync_basic_ostream_001640d8;
  *(undefined ***)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x28 =
       &PTR__sync_basic_ostream_00164100;
  *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8 = comm;
  *(undefined8 *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10 = 0;
  *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 = root;
  this_00 = (stringbuf *)operator_new(0x68);
  std::__cxx11::stringbuf::stringbuf(this_00);
  *(stringbuf **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20 = this_00;
  if ((root < 0) || (comm->m_size <= root)) {
    assert_fail("0 <= root && root < comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
                ,0x36,"sync_basic_ostream");
  }
  if (comm->m_rank == root) {
    assert_fail("root != comm.rank()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/stream.hpp"
                ,0x37,"sync_basic_ostream");
  }
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_basic_ostream<char,_std::char_traits<char>_>).
                          _vptr_basic_ostream +
                  (long)(this->super_basic_ostream<char,_std::char_traits<char>_>).
                        _vptr_basic_ostream[-3]));
  return;
}

Assistant:

sync_basic_ostream(const mxx::comm& comm, int root) : m_comm(comm), m_stream(nullptr), m_root(root), m_buf(new strbuf_t()) {
        MXX_ASSERT(0 <= root && root < comm.size());
        MXX_ASSERT(root != comm.rank()); // the root node can't have a null stream
        this->rdbuf(m_buf.get());
    }